

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::RemoveUnreachableBlocks(FlowGraph *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  FlowEdge **this_00;
  bool bVar3;
  undefined4 *puVar4;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  Type_conflict node;
  Type *ppFVar5;
  BasicBlock *pBVar6;
  BasicBlock *succ;
  FlowEdge **__edge;
  Iterator __iter;
  BasicBlock *block_1;
  BasicBlock *blockNext;
  BasicBlock *block;
  FlowGraph *this_local;
  
  if (this->blockList == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x963,"(this->blockList)","this->blockList");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  for (blockNext = this->blockList; blockNext != (BasicBlock *)0x0; blockNext = blockNext->next) {
    if ((*(ushort *)&blockNext->field_0x18 & 1) == 0) {
      *(ushort *)&blockNext->field_0x18 = *(ushort *)&blockNext->field_0x18 & 0xffdf;
    }
  }
  *(ushort *)&this->blockList->field_0x18 = *(ushort *)&this->blockList->field_0x18 & 0xffdf | 0x20;
  pBVar1 = this->blockList;
  do {
    while( true ) {
      do {
        __iter.current = (NodeBase *)pBVar1;
        if (__iter.current == (NodeBase *)0x0) {
          return;
        }
        pBVar1 = (BasicBlock *)(__iter.current)->next;
      } while (((ulong)__iter.current[3].next & 1) != 0);
      if ((*(ushort *)&__iter.current[3].next >> 5 & 1) != 0) break;
      RemoveBlock(this,(BasicBlock *)__iter.current,(GlobOpt *)0x0,false);
    }
    this_01 = &BasicBlock::GetSuccList((BasicBlock *)__iter.current)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
    while( true ) {
      if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this_00 = __edge;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
      if (bVar3) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&__edge);
      pBVar6 = FlowEdge::GetSucc(*ppFVar5);
      if (pBVar6 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x971,"(succ)","succ");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      *(ushort *)&pBVar6->field_0x18 = *(ushort *)&pBVar6->field_0x18 & 0xffdf | 0x20;
    }
  } while( true );
}

Assistant:

void
FlowGraph::RemoveUnreachableBlocks()
{
    AnalysisAssert(this->blockList);

    FOREACH_BLOCK(block, this)
    {
        block->isVisited = false;
    }
    NEXT_BLOCK;

    this->blockList->isVisited = true;

    FOREACH_BLOCK_EDITING(block, this)
    {
        if (block->isVisited)
        {
            FOREACH_SUCCESSOR_BLOCK(succ, block)
            {
                succ->isVisited = true;
            } NEXT_SUCCESSOR_BLOCK;
        }
        else
        {
            this->RemoveBlock(block);
        }
    }
    NEXT_BLOCK_EDITING;
}